

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O0

vector<unsigned_char,_std::allocator<unsigned_char>_> * ParseHexV(UniValue *v,string_view name)

{
  long lVar1;
  string_view str;
  string_view hex_str;
  undefined1 uVar2;
  bool bVar3;
  undefined8 uVar4;
  char *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  long in_FS_OFFSET;
  __sv_type _Var5;
  string strHex;
  UniValue *in_stack_ffffffffffffff28;
  UniValue *in_stack_ffffffffffffff30;
  undefined7 in_stack_ffffffffffffff38;
  undefined1 in_stack_ffffffffffffff3f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  undefined7 in_stack_ffffffffffffff58;
  undefined1 in_stack_ffffffffffffff60 [16];
  string *message;
  int code;
  size_t in_stack_ffffffffffffff90;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pbVar6 = in_RDI;
  std::__cxx11::string::string(in_stack_ffffffffffffff40);
  uVar2 = UniValue::isStr(in_stack_ffffffffffffff28);
  if ((bool)uVar2) {
    UniValue::get_str_abi_cxx11_(in_stack_ffffffffffffff30);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffff30);
  }
  _Var5 = std::__cxx11::string::operator_cast_to_basic_string_view(in_RDI);
  code = _Var5._M_len._4_4_;
  str._M_str._0_7_ = in_stack_ffffffffffffff58;
  str._M_len = (size_t)pbVar6;
  str._M_str._7_1_ = uVar2;
  bVar3 = IsHex(str);
  if (bVar3) {
    std::__cxx11::string::operator_cast_to_basic_string_view(in_RDI);
    hex_str._M_str = in_RSI;
    hex_str._M_len = in_stack_ffffffffffffff90;
    ParseHex<unsigned_char>(hex_str);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffff28);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return (vector<unsigned_char,_std::allocator<unsigned_char>_> *)pbVar6;
    }
  }
  else {
    uVar4 = __cxa_allocate_exception(0x58);
    message = in_stack_ffffffffffffff60._8_8_;
    tinyformat::format<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>
              ((char *)message,in_stack_ffffffffffffff60._0_8_,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(uVar2,in_stack_ffffffffffffff58));
    JSONRPCError(code,message);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      __cxa_throw(uVar4,&UniValue::typeinfo,UniValue::~UniValue);
    }
  }
  __stack_chk_fail();
}

Assistant:

std::vector<unsigned char> ParseHexV(const UniValue& v, std::string_view name)
{
    std::string strHex;
    if (v.isStr())
        strHex = v.get_str();
    if (!IsHex(strHex))
        throw JSONRPCError(RPC_INVALID_PARAMETER, strprintf("%s must be hexadecimal string (not '%s')", name, strHex));
    return ParseHex(strHex);
}